

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcGeometricRepresentationSubContext::~IfcGeometricRepresentationSubContext
          (IfcGeometricRepresentationSubContext *this,void **vtt)

{
  void **vtt_local;
  IfcGeometricRepresentationSubContext *this_local;
  
  (this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>._vptr_ObjectHelper =
       (_func_int **)*vtt;
  *(void **)((long)&(this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.
                    _vptr_ObjectHelper +
            (long)(this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.
                  _vptr_ObjectHelper[-3]) = vtt[0xc];
  *(void **)&(this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.
             field_0x60 = vtt[0xd];
  *(void **)&(this->super_IfcGeometricRepresentationContext).field_0xa8 = vtt[0xe];
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Maybe(&this->UserDefinedTargetView);
  std::__cxx11::string::~string((string *)&this->TargetView);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcGeometricRepresentationSubContext,_4UL>::
  ~ObjectHelper((ObjectHelper<Assimp::IFC::Schema_2x3::IfcGeometricRepresentationSubContext,_4UL> *)
                &(this->super_IfcGeometricRepresentationContext).field_0xa8,vtt + 10);
  IfcGeometricRepresentationContext::~IfcGeometricRepresentationContext
            (&this->super_IfcGeometricRepresentationContext,vtt + 1);
  return;
}

Assistant:

IfcGeometricRepresentationSubContext() : Object("IfcGeometricRepresentationSubContext") {}